

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx::ConeCurveMiMBIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Geometry *pGVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined4 uVar27;
  uint uVar28;
  undefined4 uVar29;
  long lVar30;
  long lVar32;
  RayHitK<8> *pRVar33;
  ulong uVar34;
  Scene *pSVar35;
  long lVar36;
  long lVar37;
  float fVar38;
  float fVar39;
  float fVar56;
  float fVar58;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar59;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar57;
  undefined1 auVar48 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar60;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar93;
  float fVar94;
  undefined1 auVar89 [16];
  float fVar95;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar114;
  float fVar115;
  undefined1 auVar106 [16];
  float fVar116;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar133;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [64];
  float fVar153;
  float fVar156;
  float fVar157;
  undefined1 auVar154 [16];
  float fVar158;
  undefined1 auVar155 [64];
  float fVar159;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [16];
  float fVar164;
  undefined1 auVar161 [64];
  float fVar165;
  float fVar169;
  float fVar170;
  undefined1 auVar166 [16];
  float fVar171;
  undefined1 auVar167 [16];
  undefined1 auVar168 [64];
  undefined1 auVar172 [16];
  undefined1 auVar173 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  RayQueryContext *local_458;
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  Scene *local_430;
  RayHitK<8> *local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined8 *local_3d0;
  void *local_3c8;
  RTCRayQueryContext *local_3c0;
  RayHitK<8> *local_3b8;
  undefined1 (*local_3b0) [32];
  undefined4 local_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 auStack_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [16];
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  undefined1 local_270 [8];
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined1 local_230 [16];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float local_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar31;
  
  pSVar35 = context->scene;
  uVar28 = line->sharedGeomID;
  uVar1 = (line->v0).field_0.i[0];
  pGVar5 = (pSVar35->geometries).items[uVar28].ptr;
  fVar96 = (pGVar5->time_range).lower;
  fVar96 = pGVar5->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar96) / ((pGVar5->time_range).upper - fVar96));
  auVar41 = vroundss_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),9);
  auVar41 = vminss_avx(auVar41,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar117 = vmaxss_avx(ZEXT816(0),auVar41);
  lVar36 = *(long *)&pGVar5[3].time_range.upper;
  lVar37 = (long)(int)auVar117._0_4_ * 0x38;
  lVar32 = *(long *)(lVar36 + lVar37);
  lVar30 = *(long *)(lVar36 + 0x10 + lVar37);
  auVar41 = *(undefined1 (*) [16])(lVar32 + lVar30 * (ulong)uVar1);
  uVar2 = (line->v0).field_0.i[1];
  auVar43 = *(undefined1 (*) [16])(lVar32 + lVar30 * (ulong)uVar2);
  uVar3 = (line->v0).field_0.i[2];
  auVar83 = *(undefined1 (*) [16])(lVar32 + lVar30 * (ulong)uVar3);
  uVar4 = (line->v0).field_0.i[3];
  auVar42 = *(undefined1 (*) [16])(lVar32 + lVar30 * (ulong)uVar4);
  auVar61 = *(undefined1 (*) [16])(lVar32 + lVar30 * (ulong)(uVar1 + 1));
  auVar75 = *(undefined1 (*) [16])(lVar32 + lVar30 * (ulong)(uVar2 + 1));
  auVar40 = *(undefined1 (*) [16])(lVar32 + lVar30 * (ulong)(uVar3 + 1));
  auVar62 = *(undefined1 (*) [16])(lVar32 + lVar30 * (ulong)(uVar4 + 1));
  lVar32 = *(long *)(lVar36 + 0x38 + lVar37);
  lVar36 = *(long *)(lVar36 + 0x48 + lVar37);
  auVar76 = *(undefined1 (*) [16])(lVar32 + (ulong)uVar1 * lVar36);
  auVar77 = *(undefined1 (*) [16])(lVar32 + (ulong)uVar2 * lVar36);
  auVar78 = *(undefined1 (*) [16])(lVar32 + (ulong)uVar3 * lVar36);
  auVar84 = *(undefined1 (*) [16])(lVar32 + (ulong)uVar4 * lVar36);
  auVar89 = *(undefined1 (*) [16])(lVar32 + (ulong)(uVar1 + 1) * lVar36);
  lVar30 = (ulong)(uVar3 + 1) * lVar36;
  auVar106 = *(undefined1 (*) [16])(lVar32 + lVar30);
  fVar96 = fVar96 - auVar117._0_4_;
  auVar117 = vunpcklps_avx(auVar41,auVar83);
  auVar41 = vunpckhps_avx(auVar41,auVar83);
  auVar83 = vunpcklps_avx(auVar43,auVar42);
  auVar43 = vunpckhps_avx(auVar43,auVar42);
  auVar118 = vunpcklps_avx(auVar117,auVar83);
  auVar83 = vunpckhps_avx(auVar117,auVar83);
  auVar117 = vunpcklps_avx(auVar41,auVar43);
  auVar42 = vunpckhps_avx(auVar41,auVar43);
  auVar119 = vunpcklps_avx(auVar61,auVar40);
  auVar41 = vunpckhps_avx(auVar61,auVar40);
  auVar61 = vunpcklps_avx(auVar75,auVar62);
  auVar43 = vunpckhps_avx(auVar75,auVar62);
  auVar128 = vunpcklps_avx(auVar119,auVar61);
  auVar61 = vunpckhps_avx(auVar119,auVar61);
  auVar119 = vunpcklps_avx(auVar41,auVar43);
  auVar75 = vunpckhps_avx(auVar41,auVar43);
  auVar40 = vunpcklps_avx(auVar76,auVar78);
  auVar41 = vunpckhps_avx(auVar76,auVar78);
  auVar62 = vunpcklps_avx(auVar77,auVar84);
  auVar43 = vunpckhps_avx(auVar77,auVar84);
  auVar78 = vunpcklps_avx(auVar40,auVar62);
  auVar40 = vunpckhps_avx(auVar40,auVar62);
  auVar84 = vunpcklps_avx(auVar41,auVar43);
  auVar62 = vunpckhps_avx(auVar41,auVar43);
  auVar77 = vunpcklps_avx(auVar89,auVar106);
  auVar76 = vunpckhps_avx(auVar89,auVar106);
  auVar41 = *(undefined1 (*) [16])(lVar32 + (ulong)(uVar2 + 1) * lVar36);
  auVar43 = *(undefined1 (*) [16])(lVar32 + lVar36 * (ulong)(uVar4 + 1));
  auVar89 = vunpcklps_avx(auVar41,auVar43);
  auVar41 = vunpckhps_avx(auVar41,auVar43);
  auVar106 = vunpcklps_avx(auVar77,auVar89);
  auVar77 = vunpckhps_avx(auVar77,auVar89);
  auVar89 = vunpcklps_avx(auVar76,auVar41);
  auVar76 = vunpckhps_avx(auVar76,auVar41);
  auVar41 = vshufps_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),0);
  auVar43 = vshufps_avx(ZEXT416((uint)(1.0 - fVar96)),ZEXT416((uint)(1.0 - fVar96)),0);
  fVar60 = auVar41._0_4_;
  fVar72 = auVar41._4_4_;
  fVar73 = auVar41._8_4_;
  fVar74 = auVar41._12_4_;
  local_480._0_4_ = auVar118._0_4_;
  local_480._4_4_ = auVar118._4_4_;
  fStack_478 = auVar118._8_4_;
  fStack_474 = auVar118._12_4_;
  fVar96 = auVar43._0_4_;
  fVar102 = auVar43._4_4_;
  fVar103 = auVar43._8_4_;
  fVar104 = auVar43._12_4_;
  local_350._0_4_ = fVar96 * (float)local_480._0_4_ + fVar60 * auVar78._0_4_;
  local_350._4_4_ = fVar102 * (float)local_480._4_4_ + fVar72 * auVar78._4_4_;
  fStack_348 = fVar103 * fStack_478 + fVar73 * auVar78._8_4_;
  fStack_344 = fVar104 * fStack_474 + fVar74 * auVar78._12_4_;
  local_440._0_4_ = auVar83._0_4_ * fVar96 + fVar60 * auVar40._0_4_;
  local_440._4_4_ = auVar83._4_4_ * fVar102 + fVar72 * auVar40._4_4_;
  fStack_438 = auVar83._8_4_ * fVar103 + fVar73 * auVar40._8_4_;
  fStack_434 = auVar83._12_4_ * fVar104 + fVar74 * auVar40._12_4_;
  auVar160._0_4_ = auVar117._0_4_ * fVar96 + fVar60 * auVar84._0_4_;
  auVar160._4_4_ = auVar117._4_4_ * fVar102 + fVar72 * auVar84._4_4_;
  auVar160._8_4_ = auVar117._8_4_ * fVar103 + fVar73 * auVar84._8_4_;
  auVar160._12_4_ = auVar117._12_4_ * fVar104 + fVar74 * auVar84._12_4_;
  auVar140._8_4_ = 0x3f800000;
  auVar140._0_8_ = &DAT_3f8000003f800000;
  auVar140._12_4_ = 0x3f800000;
  local_480._0_4_ = fVar96 * auVar42._0_4_ + fVar60 * auVar62._0_4_;
  local_480._4_4_ = fVar102 * auVar42._4_4_ + fVar72 * auVar62._4_4_;
  fStack_478 = fVar103 * auVar42._8_4_ + fVar73 * auVar62._8_4_;
  fStack_474 = fVar104 * auVar42._12_4_ + fVar74 * auVar62._12_4_;
  auVar166._0_4_ = auVar128._0_4_ * fVar96 + fVar60 * auVar106._0_4_;
  auVar166._4_4_ = auVar128._4_4_ * fVar102 + fVar72 * auVar106._4_4_;
  auVar166._8_4_ = auVar128._8_4_ * fVar103 + fVar73 * auVar106._8_4_;
  auVar166._12_4_ = auVar128._12_4_ * fVar104 + fVar74 * auVar106._12_4_;
  auVar106._0_4_ = auVar61._0_4_ * fVar96 + fVar60 * auVar77._0_4_;
  auVar106._4_4_ = auVar61._4_4_ * fVar102 + fVar72 * auVar77._4_4_;
  auVar106._8_4_ = auVar61._8_4_ * fVar103 + fVar73 * auVar77._8_4_;
  auVar106._12_4_ = auVar61._12_4_ * fVar104 + fVar74 * auVar77._12_4_;
  local_4a0 = auVar119._0_4_;
  fStack_49c = auVar119._4_4_;
  fStack_498 = auVar119._8_4_;
  fStack_494 = auVar119._12_4_;
  auVar154._0_4_ = fVar96 * local_4a0 + fVar60 * auVar89._0_4_;
  auVar154._4_4_ = fVar102 * fStack_49c + fVar72 * auVar89._4_4_;
  auVar154._8_4_ = fVar103 * fStack_498 + fVar73 * auVar89._8_4_;
  auVar154._12_4_ = fVar104 * fStack_494 + fVar74 * auVar89._12_4_;
  local_3a0._0_4_ = auVar75._0_4_;
  local_3a0._4_4_ = auVar75._4_4_;
  fStack_398 = auVar75._8_4_;
  fStack_394 = auVar75._12_4_;
  auVar40._0_4_ = fVar96 * (float)local_3a0._0_4_ + fVar60 * auVar76._0_4_;
  auVar40._4_4_ = fVar102 * (float)local_3a0._4_4_ + fVar72 * auVar76._4_4_;
  auVar40._8_4_ = fVar103 * fStack_398 + fVar73 * auVar76._8_4_;
  auVar40._12_4_ = fVar104 * fStack_394 + fVar74 * auVar76._12_4_;
  auVar41 = vpcmpeqd_avx(auVar40,auVar40);
  auVar43 = vpcmpeqd_avx(auVar41,(undefined1  [16])(line->primIDs).field_0);
  local_210 = vshufps_avx(ZEXT416(uVar28),ZEXT416(uVar28),0);
  local_3a0._4_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
  fVar96 = *(float *)(ray + k * 4 + 0xa0);
  local_240 = *(float *)(ray + k * 4 + 0xc0);
  auVar41 = ZEXT416((uint)((float)local_3a0._4_4_ * (float)local_3a0._4_4_ +
                          fVar96 * fVar96 + local_240 * local_240));
  auVar83 = vshufps_avx(auVar41,auVar41,0);
  auVar41 = vrcpps_avx(auVar83);
  fVar60 = auVar41._0_4_;
  auVar42._0_4_ = fVar60 * auVar83._0_4_;
  fVar72 = auVar41._4_4_;
  auVar42._4_4_ = fVar72 * auVar83._4_4_;
  fVar73 = auVar41._8_4_;
  auVar42._8_4_ = fVar73 * auVar83._8_4_;
  fVar74 = auVar41._12_4_;
  auVar42._12_4_ = fVar74 * auVar83._12_4_;
  auVar41 = vsubps_avx(auVar140,auVar42);
  auVar61._0_4_ = ((float)local_350._0_4_ + auVar166._0_4_) * 0.5;
  auVar61._4_4_ = ((float)local_350._4_4_ + auVar166._4_4_) * 0.5;
  auVar61._8_4_ = (fStack_348 + auVar166._8_4_) * 0.5;
  auVar61._12_4_ = (fStack_344 + auVar166._12_4_) * 0.5;
  auVar83._0_4_ = ((float)local_440._0_4_ + auVar106._0_4_) * 0.5;
  auVar83._4_4_ = ((float)local_440._4_4_ + auVar106._4_4_) * 0.5;
  auVar83._8_4_ = (fStack_438 + auVar106._8_4_) * 0.5;
  auVar83._12_4_ = (fStack_434 + auVar106._12_4_) * 0.5;
  auVar75._0_4_ = (auVar160._0_4_ + auVar154._0_4_) * 0.5;
  auVar75._4_4_ = (auVar160._4_4_ + auVar154._4_4_) * 0.5;
  auVar75._8_4_ = (auVar160._8_4_ + auVar154._8_4_) * 0.5;
  auVar75._12_4_ = (auVar160._12_4_ + auVar154._12_4_) * 0.5;
  fVar102 = *(float *)(ray + k * 4 + 0x20);
  auVar89._4_4_ = fVar102;
  auVar89._0_4_ = fVar102;
  auVar89._8_4_ = fVar102;
  auVar89._12_4_ = fVar102;
  auVar83 = vsubps_avx(auVar83,auVar89);
  fVar103 = *(float *)(ray + k * 4 + 0x40);
  auVar141._4_4_ = fVar103;
  auVar141._0_4_ = fVar103;
  auVar141._8_4_ = fVar103;
  auVar141._12_4_ = fVar103;
  auVar42 = vsubps_avx(auVar75,auVar141);
  fVar104 = *(float *)(ray + k * 4);
  auVar84._4_4_ = fVar104;
  auVar84._0_4_ = fVar104;
  auVar84._8_4_ = fVar104;
  auVar84._12_4_ = fVar104;
  auVar61 = vsubps_avx(auVar61,auVar84);
  local_3e0._0_4_ =
       (auVar61._0_4_ * (float)local_3a0._4_4_ + fVar96 * auVar83._0_4_ + local_240 * auVar42._0_4_)
       * (fVar60 + fVar60 * auVar41._0_4_);
  local_3e0._4_4_ =
       (auVar61._4_4_ * (float)local_3a0._4_4_ + fVar96 * auVar83._4_4_ + local_240 * auVar42._4_4_)
       * (fVar72 + fVar72 * auVar41._4_4_);
  fStack_3d8 = (auVar61._8_4_ * (float)local_3a0._4_4_ +
               fVar96 * auVar83._8_4_ + local_240 * auVar42._8_4_) *
               (fVar73 + fVar73 * auVar41._8_4_);
  fStack_3d4 = (auVar61._12_4_ * (float)local_3a0._4_4_ +
               fVar96 * auVar83._12_4_ + local_240 * auVar42._12_4_) *
               (fVar74 + fVar74 * auVar41._12_4_);
  auVar76._0_4_ = fVar104 + (float)local_3a0._4_4_ * (float)local_3e0._0_4_;
  auVar76._4_4_ = fVar104 + (float)local_3a0._4_4_ * (float)local_3e0._4_4_;
  auVar76._8_4_ = fVar104 + (float)local_3a0._4_4_ * fStack_3d8;
  auVar76._12_4_ = fVar104 + (float)local_3a0._4_4_ * fStack_3d4;
  auVar172._0_4_ = fVar102 + fVar96 * (float)local_3e0._0_4_;
  auVar172._4_4_ = fVar102 + fVar96 * (float)local_3e0._4_4_;
  auVar172._8_4_ = fVar102 + fVar96 * fStack_3d8;
  auVar172._12_4_ = fVar102 + fVar96 * fStack_3d4;
  auVar142._0_4_ = fVar103 + local_240 * (float)local_3e0._0_4_;
  auVar142._4_4_ = fVar103 + local_240 * (float)local_3e0._4_4_;
  auVar142._8_4_ = fVar103 + local_240 * fStack_3d8;
  auVar142._12_4_ = fVar103 + local_240 * fStack_3d4;
  local_230 = vsubps_avx(auVar106,_local_440);
  local_290 = vsubps_avx(auVar154,auVar160);
  fVar102 = local_290._0_4_;
  fVar73 = local_290._4_4_;
  fVar9 = local_290._8_4_;
  fVar13 = local_290._12_4_;
  fVar103 = local_230._0_4_;
  fVar74 = local_230._4_4_;
  fVar10 = local_230._8_4_;
  fVar14 = local_230._12_4_;
  auVar83 = vsubps_avx(auVar166,_local_350);
  fVar104 = auVar83._0_4_;
  fVar6 = auVar83._4_4_;
  fVar11 = auVar83._8_4_;
  fVar15 = auVar83._12_4_;
  fVar38 = fVar104 * fVar104 + fVar103 * fVar103 + fVar102 * fVar102;
  fVar56 = fVar6 * fVar6 + fVar74 * fVar74 + fVar73 * fVar73;
  fVar58 = fVar11 * fVar11 + fVar10 * fVar10 + fVar9 * fVar9;
  fVar59 = fVar15 * fVar15 + fVar14 * fVar14 + fVar13 * fVar13;
  _local_440 = vsubps_avx(auVar172,_local_440);
  local_2a0 = vsubps_avx(auVar142,auVar160);
  fVar165 = local_2a0._0_4_;
  fVar169 = local_2a0._4_4_;
  fVar170 = local_2a0._8_4_;
  fVar171 = local_2a0._12_4_;
  fVar60 = local_440._0_4_;
  fVar7 = local_440._4_4_;
  fVar12 = local_440._8_4_;
  fVar16 = local_440._12_4_;
  _local_350 = vsubps_avx(auVar76,_local_350);
  fVar159 = local_350._0_4_;
  fVar162 = local_350._4_4_;
  fVar163 = local_350._8_4_;
  fVar164 = local_350._12_4_;
  fVar153 = fVar165 * fVar102 + fVar103 * fVar60 + fVar159 * fVar104;
  fVar156 = fVar169 * fVar73 + fVar74 * fVar7 + fVar162 * fVar6;
  fVar157 = fVar170 * fVar9 + fVar10 * fVar12 + fVar163 * fVar11;
  fVar158 = fVar171 * fVar13 + fVar14 * fVar16 + fVar164 * fVar15;
  auVar150._0_4_ = fVar104 * (float)local_3a0._4_4_ + fVar96 * fVar103 + local_240 * fVar102;
  auVar150._4_4_ = fVar6 * (float)local_3a0._4_4_ + fVar96 * fVar74 + local_240 * fVar73;
  auVar150._8_4_ = fVar11 * (float)local_3a0._4_4_ + fVar96 * fVar10 + local_240 * fVar9;
  auVar150._12_4_ = fVar15 * (float)local_3a0._4_4_ + fVar96 * fVar14 + local_240 * fVar13;
  local_3a0._0_4_ = local_3a0._4_4_;
  fStack_398 = (float)local_3a0._4_4_;
  fStack_394 = (float)local_3a0._4_4_;
  auVar41 = vsubps_avx(_local_480,auVar40);
  fVar72 = auVar41._0_4_;
  fVar8 = auVar41._4_4_;
  fVar39 = auVar41._8_4_;
  fVar57 = auVar41._12_4_;
  fVar88 = fVar72 * fVar72 + fVar38;
  fVar93 = fVar8 * fVar8 + fVar56;
  fVar94 = fVar39 * fVar39 + fVar58;
  fVar95 = fVar57 * fVar57 + fVar59;
  local_220._0_4_ = fVar38 * fVar38;
  local_220._4_4_ = fVar56 * fVar56;
  fStack_218 = fVar58 * fVar58;
  fStack_214 = fVar59 * fVar59;
  auVar41._0_4_ =
       (float)local_220._0_4_ *
       (fVar159 * (float)local_3a0._4_4_ + fVar96 * fVar60 + local_240 * fVar165);
  auVar41._4_4_ =
       (float)local_220._4_4_ *
       (fVar162 * (float)local_3a0._4_4_ + fVar96 * fVar7 + local_240 * fVar169);
  auVar41._8_4_ =
       fStack_218 * (fVar163 * (float)local_3a0._4_4_ + fVar96 * fVar12 + local_240 * fVar170);
  auVar41._12_4_ =
       fStack_214 * (fVar164 * (float)local_3a0._4_4_ + fVar96 * fVar16 + local_240 * fVar171);
  auVar117._0_4_ = fVar88 * auVar150._0_4_ * fVar153;
  auVar117._4_4_ = fVar93 * auVar150._4_4_ * fVar156;
  auVar117._8_4_ = fVar94 * auVar150._8_4_ * fVar157;
  auVar117._12_4_ = fVar95 * auVar150._12_4_ * fVar158;
  auVar41 = vsubps_avx(auVar41,auVar117);
  auVar118._0_4_ = (float)local_480._0_4_ * fVar38;
  auVar118._4_4_ = (float)local_480._4_4_ * fVar56;
  auVar118._8_4_ = fStack_478 * fVar58;
  auVar118._12_4_ = fStack_474 * fVar59;
  auVar62._0_4_ = auVar150._0_4_ * fVar72 * auVar118._0_4_ + auVar41._0_4_;
  auVar62._4_4_ = auVar150._4_4_ * fVar8 * auVar118._4_4_ + auVar41._4_4_;
  auVar62._8_4_ = auVar150._8_4_ * fVar39 * auVar118._8_4_ + auVar41._8_4_;
  auVar62._12_4_ = auVar150._12_4_ * fVar57 * auVar118._12_4_ + auVar41._12_4_;
  auVar77._0_4_ = (float)local_220._0_4_ * (fVar159 * fVar159 + fVar60 * fVar60 + fVar165 * fVar165)
  ;
  auVar77._4_4_ = (float)local_220._4_4_ * (fVar162 * fVar162 + fVar7 * fVar7 + fVar169 * fVar169);
  auVar77._8_4_ = fStack_218 * (fVar163 * fVar163 + fVar12 * fVar12 + fVar170 * fVar170);
  auVar77._12_4_ = fStack_214 * (fVar164 * fVar164 + fVar16 * fVar16 + fVar171 * fVar171);
  auVar128._0_4_ = fVar153 * fVar153 * fVar88;
  auVar128._4_4_ = fVar156 * fVar156 * fVar93;
  auVar128._8_4_ = fVar157 * fVar157 * fVar94;
  auVar128._12_4_ = fVar158 * fVar158 * fVar95;
  auVar41 = vsubps_avx(auVar77,auVar128);
  auVar129._0_4_ = (fVar72 + fVar72) * fVar153;
  auVar129._4_4_ = (fVar8 + fVar8) * fVar156;
  auVar129._8_4_ = (fVar39 + fVar39) * fVar157;
  auVar129._12_4_ = (fVar57 + fVar57) * fVar158;
  auVar42 = vsubps_avx(auVar129,auVar118);
  fVar105 = auVar150._0_4_ * auVar150._0_4_;
  fVar114 = auVar150._4_4_ * auVar150._4_4_;
  fVar115 = auVar150._8_4_ * auVar150._8_4_;
  fVar116 = auVar150._12_4_ * auVar150._12_4_;
  auVar78._0_4_ = fVar88 * fVar105;
  auVar78._4_4_ = fVar93 * fVar114;
  auVar78._8_4_ = fVar94 * fVar115;
  auVar78._12_4_ = fVar95 * fVar116;
  auVar61 = vsubps_avx(_local_220,auVar78);
  auVar119._0_4_ = auVar61._0_4_ * (auVar41._0_4_ + auVar42._0_4_ * auVar118._0_4_);
  auVar119._4_4_ = auVar61._4_4_ * (auVar41._4_4_ + auVar42._4_4_ * auVar118._4_4_);
  auVar119._8_4_ = auVar61._8_4_ * (auVar41._8_4_ + auVar42._8_4_ * auVar118._8_4_);
  auVar119._12_4_ = auVar61._12_4_ * (auVar41._12_4_ + auVar42._12_4_ * auVar118._12_4_);
  auVar130._0_4_ = auVar62._0_4_ * auVar62._0_4_;
  auVar130._4_4_ = auVar62._4_4_ * auVar62._4_4_;
  auVar130._8_4_ = auVar62._8_4_ * auVar62._8_4_;
  auVar130._12_4_ = auVar62._12_4_ * auVar62._12_4_;
  auVar42 = vsubps_avx(auVar130,auVar119);
  auVar77 = ZEXT816(0) << 0x20;
  auVar41 = vcmpps_avx(auVar42,auVar77,5);
  auVar75 = auVar41 & ~auVar43;
  if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar75[0xf] < '\0') {
    auVar75 = vandnps_avx(auVar43,auVar41);
    auVar76 = vsubps_avx(auVar76,auVar166);
    auVar78 = vsubps_avx(auVar172,auVar106);
    auVar84 = vsubps_avx(auVar142,auVar154);
    auVar41 = vrcpps_avx(auVar61);
    fVar133 = auVar41._0_4_;
    auVar143._0_4_ = fVar133 * auVar61._0_4_;
    fVar137 = auVar41._4_4_;
    auVar143._4_4_ = fVar137 * auVar61._4_4_;
    fVar138 = auVar41._8_4_;
    auVar143._8_4_ = fVar138 * auVar61._8_4_;
    fVar139 = auVar41._12_4_;
    auVar143._12_4_ = fVar139 * auVar61._12_4_;
    auVar43._8_4_ = 0x3f800000;
    auVar43._0_8_ = &DAT_3f8000003f800000;
    auVar43._12_4_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar43,auVar143);
    fVar133 = fVar133 + fVar133 * auVar41._0_4_;
    fVar137 = fVar137 + fVar137 * auVar41._4_4_;
    fVar138 = fVar138 + fVar138 * auVar41._8_4_;
    fVar139 = fVar139 + fVar139 * auVar41._12_4_;
    auVar144._8_4_ = 0x7fffffff;
    auVar144._0_8_ = 0x7fffffff7fffffff;
    auVar144._12_4_ = 0x7fffffff;
    auVar41 = vandps_avx(auVar144,auVar61);
    auVar145._8_4_ = 0x219392ef;
    auVar145._0_8_ = 0x219392ef219392ef;
    auVar145._12_4_ = 0x219392ef;
    auVar41 = vcmpps_avx(auVar41,auVar145,2);
    auVar43 = vsqrtps_avx(auVar42);
    uVar31 = CONCAT44(auVar62._4_4_,auVar62._0_4_);
    auVar146._0_8_ = uVar31 ^ 0x8000000080000000;
    auVar146._8_4_ = -auVar62._8_4_;
    auVar146._12_4_ = -auVar62._12_4_;
    auVar42 = vsubps_avx(auVar146,auVar43);
    auVar43 = vsubps_avx(auVar43,auVar62);
    auVar120._0_4_ = auVar42._0_4_ * fVar133;
    auVar120._4_4_ = auVar42._4_4_ * fVar137;
    auVar120._8_4_ = auVar42._8_4_ * fVar138;
    auVar120._12_4_ = auVar42._12_4_ * fVar139;
    auVar63._0_4_ = fVar133 * auVar43._0_4_;
    auVar63._4_4_ = fVar137 * auVar43._4_4_;
    auVar63._8_4_ = fVar138 * auVar43._8_4_;
    auVar63._12_4_ = fVar139 * auVar43._12_4_;
    auVar44._8_4_ = 0xff800000;
    auVar44._0_8_ = 0xff800000ff800000;
    auVar44._12_4_ = 0xff800000;
    auVar43 = vblendvps_avx(auVar120,auVar44,auVar41);
    auVar147._8_4_ = 0x7f800000;
    auVar147._0_8_ = 0x7f8000007f800000;
    auVar147._12_4_ = 0x7f800000;
    auVar42 = vblendvps_avx(auVar63,auVar147,auVar41);
    auVar131._0_4_ = fVar153 + auVar150._0_4_ * auVar43._0_4_;
    auVar131._4_4_ = fVar156 + auVar150._4_4_ * auVar43._4_4_;
    auVar131._8_4_ = fVar157 + auVar150._8_4_ * auVar43._8_4_;
    auVar131._12_4_ = fVar158 + auVar150._12_4_ * auVar43._12_4_;
    auVar41 = vcmpps_avx(auVar131,auVar77,6);
    auVar25._4_4_ = fVar56;
    auVar25._0_4_ = fVar38;
    auVar25._8_4_ = fVar58;
    auVar25._12_4_ = fVar59;
    auVar61 = vcmpps_avx(auVar131,auVar25,1);
    auVar41 = vandps_avx(auVar61,auVar41);
    auVar41 = vandps_avx(auVar41,auVar75);
    local_2c0 = vblendvps_avx(auVar147,auVar43,auVar41);
    local_270._0_4_ = fVar153 + auVar150._0_4_ * auVar42._0_4_;
    local_270._4_4_ = fVar156 + auVar150._4_4_ * auVar42._4_4_;
    fStack_268 = fVar157 + auVar150._8_4_ * auVar42._8_4_;
    fStack_264 = fVar158 + auVar150._12_4_ * auVar42._12_4_;
    auVar41 = vcmpps_avx(_local_270,auVar77,6);
    auVar43 = vcmpps_avx(_local_270,auVar25,1);
    auVar41 = vandps_avx(auVar43,auVar41);
    auVar41 = vandps_avx(auVar41,auVar75);
    local_3f0 = vblendvps_avx(auVar44,auVar42,auVar41);
    auVar41 = vrcpps_avx(auVar150);
    fVar133 = auVar41._0_4_;
    auVar79._0_4_ = auVar150._0_4_ * fVar133;
    fVar137 = auVar41._4_4_;
    auVar79._4_4_ = auVar150._4_4_ * fVar137;
    fVar138 = auVar41._8_4_;
    auVar79._8_4_ = auVar150._8_4_ * fVar138;
    fVar139 = auVar41._12_4_;
    auVar79._12_4_ = auVar150._12_4_ * fVar139;
    auVar45._8_4_ = 0x3f800000;
    auVar45._0_8_ = &DAT_3f8000003f800000;
    auVar45._12_4_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar45,auVar79);
    fVar133 = fVar133 + fVar133 * auVar41._0_4_;
    fVar137 = fVar137 + fVar137 * auVar41._4_4_;
    fVar138 = fVar138 + fVar138 * auVar41._8_4_;
    fVar139 = fVar139 + fVar139 * auVar41._12_4_;
    auVar80._0_4_ = auVar150._0_4_ * fVar159;
    auVar80._4_4_ = auVar150._4_4_ * fVar162;
    auVar80._8_4_ = auVar150._8_4_ * fVar163;
    auVar80._12_4_ = auVar150._12_4_ * fVar164;
    auVar107._0_4_ = (float)local_3a0._4_4_ * fVar153;
    auVar107._4_4_ = (float)local_3a0._4_4_ * fVar156;
    auVar107._8_4_ = (float)local_3a0._4_4_ * fVar157;
    auVar107._12_4_ = (float)local_3a0._4_4_ * fVar158;
    auVar41 = vsubps_avx(auVar80,auVar107);
    auVar108._0_4_ = auVar150._0_4_ * fVar60;
    auVar108._4_4_ = auVar150._4_4_ * fVar7;
    auVar108._8_4_ = auVar150._8_4_ * fVar12;
    auVar108._12_4_ = auVar150._12_4_ * fVar16;
    auVar121._0_4_ = fVar96 * fVar153;
    auVar121._4_4_ = fVar96 * fVar156;
    auVar121._8_4_ = fVar96 * fVar157;
    auVar121._12_4_ = fVar96 * fVar158;
    auVar43 = vsubps_avx(auVar108,auVar121);
    auVar122._0_4_ = auVar150._0_4_ * fVar165;
    auVar122._4_4_ = auVar150._4_4_ * fVar169;
    auVar122._8_4_ = auVar150._8_4_ * fVar170;
    auVar122._12_4_ = auVar150._12_4_ * fVar171;
    auVar167._0_4_ = fVar153 * local_240;
    auVar167._4_4_ = fVar156 * local_240;
    auVar167._8_4_ = fVar157 * local_240;
    auVar167._12_4_ = fVar158 * local_240;
    auVar42 = vsubps_avx(auVar122,auVar167);
    auVar81._0_4_ =
         auVar41._0_4_ * auVar41._0_4_ +
         auVar43._0_4_ * auVar43._0_4_ + auVar42._0_4_ * auVar42._0_4_;
    auVar81._4_4_ =
         auVar41._4_4_ * auVar41._4_4_ +
         auVar43._4_4_ * auVar43._4_4_ + auVar42._4_4_ * auVar42._4_4_;
    auVar81._8_4_ =
         auVar41._8_4_ * auVar41._8_4_ +
         auVar43._8_4_ * auVar43._8_4_ + auVar42._8_4_ * auVar42._8_4_;
    auVar81._12_4_ =
         auVar41._12_4_ * auVar41._12_4_ +
         auVar43._12_4_ * auVar43._12_4_ + auVar42._12_4_ * auVar42._12_4_;
    auVar109._0_4_ = (float)local_480._0_4_ * (float)local_480._0_4_ * fVar105;
    auVar109._4_4_ = (float)local_480._4_4_ * (float)local_480._4_4_ * fVar114;
    auVar109._8_4_ = fStack_478 * fStack_478 * fVar115;
    auVar109._12_4_ = fStack_474 * fStack_474 * fVar116;
    auVar41 = vcmpps_avx(auVar81,auVar109,1);
    auVar110._0_4_ = fVar133 * -fVar153;
    auVar110._4_4_ = fVar137 * -fVar156;
    auVar110._8_4_ = fVar138 * -fVar157;
    auVar110._12_4_ = fVar139 * -fVar158;
    auVar43 = vblendvps_avx(auVar147,auVar110,auVar41);
    auVar41 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar75);
    local_380 = vblendvps_avx(auVar147,auVar43,auVar41);
    local_280._0_4_ = auVar76._0_4_;
    local_280._4_4_ = auVar76._4_4_;
    fStack_278 = auVar76._8_4_;
    fStack_274 = auVar76._12_4_;
    fVar153 = (float)local_280._0_4_ * fVar104 + fVar103 * auVar78._0_4_ + auVar84._0_4_ * fVar102;
    fVar156 = (float)local_280._4_4_ * fVar6 + fVar74 * auVar78._4_4_ + auVar84._4_4_ * fVar73;
    fVar157 = fStack_278 * fVar11 + fVar10 * auVar78._8_4_ + auVar84._8_4_ * fVar9;
    fVar158 = fStack_274 * fVar15 + fVar14 * auVar78._12_4_ + auVar84._12_4_ * fVar13;
    auVar111._0_4_ = auVar150._0_4_ * (float)local_280._0_4_;
    auVar111._4_4_ = auVar150._4_4_ * (float)local_280._4_4_;
    auVar111._8_4_ = auVar150._8_4_ * fStack_278;
    auVar111._12_4_ = auVar150._12_4_ * fStack_274;
    auVar46._0_4_ = auVar150._0_4_ * auVar78._0_4_;
    auVar46._4_4_ = auVar150._4_4_ * auVar78._4_4_;
    auVar46._8_4_ = auVar150._8_4_ * auVar78._8_4_;
    auVar46._12_4_ = auVar150._12_4_ * auVar78._12_4_;
    auVar90._0_4_ = auVar150._0_4_ * auVar84._0_4_;
    auVar90._4_4_ = auVar150._4_4_ * auVar84._4_4_;
    auVar90._8_4_ = auVar150._8_4_ * auVar84._8_4_;
    auVar90._12_4_ = auVar150._12_4_ * auVar84._12_4_;
    auVar123._0_4_ = (float)local_3a0._4_4_ * fVar153;
    auVar123._4_4_ = (float)local_3a0._4_4_ * fVar156;
    auVar123._8_4_ = (float)local_3a0._4_4_ * fVar157;
    auVar123._12_4_ = (float)local_3a0._4_4_ * fVar158;
    auVar41 = vsubps_avx(auVar111,auVar123);
    auVar124._0_4_ = fVar96 * fVar153;
    auVar124._4_4_ = fVar96 * fVar156;
    auVar124._8_4_ = fVar96 * fVar157;
    auVar124._12_4_ = fVar96 * fVar158;
    auVar43 = vsubps_avx(auVar46,auVar124);
    fStack_23c = local_240;
    fStack_238 = local_240;
    fStack_234 = local_240;
    auVar125._0_4_ = local_240 * fVar153;
    auVar125._4_4_ = local_240 * fVar156;
    auVar125._8_4_ = local_240 * fVar157;
    auVar125._12_4_ = local_240 * fVar158;
    auVar42 = vsubps_avx(auVar90,auVar125);
    auVar47._0_4_ =
         auVar41._0_4_ * auVar41._0_4_ +
         auVar43._0_4_ * auVar43._0_4_ + auVar42._0_4_ * auVar42._0_4_;
    auVar47._4_4_ =
         auVar41._4_4_ * auVar41._4_4_ +
         auVar43._4_4_ * auVar43._4_4_ + auVar42._4_4_ * auVar42._4_4_;
    auVar47._8_4_ =
         auVar41._8_4_ * auVar41._8_4_ +
         auVar43._8_4_ * auVar43._8_4_ + auVar42._8_4_ * auVar42._8_4_;
    auVar47._12_4_ =
         auVar41._12_4_ * auVar41._12_4_ +
         auVar43._12_4_ * auVar43._12_4_ + auVar42._12_4_ * auVar42._12_4_;
    auVar91._0_4_ = fVar105 * auVar40._0_4_ * auVar40._0_4_;
    auVar91._4_4_ = fVar114 * auVar40._4_4_ * auVar40._4_4_;
    auVar91._8_4_ = fVar115 * auVar40._8_4_ * auVar40._8_4_;
    auVar91._12_4_ = fVar116 * auVar40._12_4_ * auVar40._12_4_;
    uVar27 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar112._4_4_ = uVar27;
    auVar112._0_4_ = uVar27;
    auVar112._8_4_ = uVar27;
    auVar112._12_4_ = uVar27;
    auVar41 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar75);
    auVar43 = vcmpps_avx(auVar47,auVar91,1);
    auVar64._0_4_ = fVar133 * -fVar153;
    auVar64._4_4_ = fVar137 * -fVar156;
    auVar64._8_4_ = fVar138 * -fVar157;
    auVar64._12_4_ = fVar139 * -fVar158;
    auVar43 = vblendvps_avx(auVar147,auVar64,auVar43);
    auVar41 = vblendvps_avx(auVar147,auVar43,auVar41);
    auVar61 = vminps_avx(local_380,auVar41);
    auVar43 = vmaxps_avx(local_380,auVar41);
    auVar40 = vminps_avx(local_2c0,auVar61);
    auVar41 = vcmpps_avx(auVar147,auVar43,0);
    auVar85._8_4_ = 0xff800000;
    auVar85._0_8_ = 0xff800000ff800000;
    auVar85._12_4_ = 0xff800000;
    auVar41 = vblendvps_avx(auVar43,auVar85,auVar41);
    auVar42 = vcmpps_avx(auVar40,auVar61,0);
    auVar43 = vcmpps_avx(auVar147,auVar61,0);
    auVar43 = vblendvps_avx(auVar61,auVar85,auVar43);
    auVar41 = vblendvps_avx(auVar43,auVar41,auVar42);
    _local_280 = vmaxps_avx(local_3f0,auVar41);
    auVar65._0_4_ = (float)local_3e0._0_4_ + auVar40._0_4_;
    auVar65._4_4_ = (float)local_3e0._4_4_ + auVar40._4_4_;
    auVar65._8_4_ = fStack_3d8 + auVar40._8_4_;
    auVar65._12_4_ = fStack_3d4 + auVar40._12_4_;
    auVar41 = vcmpps_avx(auVar112,auVar65,2);
    uVar27 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar92._4_4_ = uVar27;
    auVar92._0_4_ = uVar27;
    auVar92._8_4_ = uVar27;
    auVar92._12_4_ = uVar27;
    auVar43 = vcmpps_avx(auVar65,auVar92,2);
    auVar41 = vandps_avx(auVar41,auVar43);
    auVar43 = vcmpps_avx(auVar147,auVar40,4);
    local_360 = vandps_avx(auVar41,auVar43);
    local_450._0_4_ = (float)local_3e0._0_4_ + local_280._0_4_;
    local_450._4_4_ = (float)local_3e0._4_4_ + local_280._4_4_;
    local_450._8_4_ = fStack_3d8 + local_280._8_4_;
    local_450._12_4_ = fStack_3d4 + local_280._12_4_;
    auVar41 = vcmpps_avx(auVar112,local_450,2);
    auVar43 = vcmpps_avx(local_450,auVar92,2);
    auVar41 = vandps_avx(auVar41,auVar43);
    auVar43 = vandps_avx(local_360,auVar75);
    auVar42 = vcmpps_avx(auVar85,_local_280,4);
    auVar42 = vandps_avx(auVar42,auVar75);
    local_370 = vandps_avx(auVar41,auVar42);
    local_470 = vorps_avx(auVar43,local_370);
    if ((((local_470 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_470 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_470 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_470[0xf] < '\0') {
      auVar42 = vblendvps_avx(_local_280,auVar40,auVar43);
      auVar61 = vblendvps_avx(_local_270,auVar131,auVar43);
      local_2e0._0_16_ = local_470;
      auVar26._4_4_ = fVar56;
      auVar26._0_4_ = fVar38;
      auVar26._8_4_ = fVar58;
      auVar26._12_4_ = fVar59;
      local_480._0_4_ = fVar38 * fVar72 * (float)local_480._0_4_;
      local_480._4_4_ = fVar56 * fVar8 * (float)local_480._4_4_;
      fStack_478 = fVar58 * fVar39 * fStack_478;
      fStack_474 = fVar59 * fVar57 * fStack_474;
      auVar41 = vcmpps_avx(local_2c0,auVar42,0);
      auVar43 = vcmpps_avx(auVar42,local_3f0,0);
      auVar41 = vorps_avx(auVar41,auVar43);
      auVar41 = vandps_avx(auVar41,auVar75);
      auVar43 = vcmpps_avx(local_380,auVar42,0);
      auVar43 = vandps_avx(auVar43,auVar75);
      fVar39 = auVar42._0_4_;
      fVar57 = auVar42._4_4_;
      fVar105 = auVar42._8_4_;
      fVar114 = auVar42._12_4_;
      local_190 = fVar104 * (float)local_480._0_4_;
      fStack_18c = fVar6 * (float)local_480._4_4_;
      fStack_188 = fVar11 * fStack_478;
      fStack_184 = fVar15 * fStack_474;
      auVar82._0_4_ =
           fVar104 * (float)local_480._0_4_ +
           (float)local_220._0_4_ * (fVar39 * (float)local_3a0._4_4_ + fVar159);
      auVar82._4_4_ =
           fVar6 * (float)local_480._4_4_ +
           (float)local_220._4_4_ * (fVar57 * (float)local_3a0._4_4_ + fVar162);
      auVar82._8_4_ =
           fVar11 * fStack_478 + fStack_218 * (fVar105 * (float)local_3a0._4_4_ + fVar163);
      auVar82._12_4_ =
           fVar15 * fStack_474 + fStack_214 * (fVar114 * (float)local_3a0._4_4_ + fVar164);
      local_1b0 = fVar104 * fVar88;
      fStack_1ac = fVar6 * fVar93;
      fStack_1a8 = fVar11 * fVar94;
      fStack_1a4 = fVar15 * fVar95;
      fVar72 = auVar61._0_4_;
      auVar134._0_4_ = fVar104 * fVar88 * fVar72;
      fVar104 = auVar61._4_4_;
      auVar134._4_4_ = fVar6 * fVar93 * fVar104;
      fVar6 = auVar61._8_4_;
      auVar134._8_4_ = fVar11 * fVar94 * fVar6;
      fVar8 = auVar61._12_4_;
      auVar134._12_4_ = fVar15 * fVar95 * fVar8;
      auVar61 = vsubps_avx(auVar82,auVar134);
      local_1a0 = fVar103 * (float)local_480._0_4_;
      fStack_19c = fVar74 * (float)local_480._4_4_;
      fStack_198 = fVar10 * fStack_478;
      fStack_194 = fVar14 * fStack_474;
      auVar135._0_4_ =
           fVar103 * (float)local_480._0_4_ + (fVar39 * fVar96 + fVar60) * (float)local_220._0_4_;
      auVar135._4_4_ =
           fVar74 * (float)local_480._4_4_ + (fVar57 * fVar96 + fVar7) * (float)local_220._4_4_;
      auVar135._8_4_ = fVar10 * fStack_478 + (fVar105 * fVar96 + fVar12) * fStack_218;
      auVar135._12_4_ = fVar14 * fStack_474 + (fVar114 * fVar96 + fVar16) * fStack_214;
      fStack_25c = fVar93 * fVar74;
      local_260 = fVar88 * fVar103;
      fStack_258 = fVar94 * fVar10;
      fStack_254 = fVar95 * fVar14;
      auVar148._0_4_ = fVar88 * fVar103 * fVar72;
      auVar148._4_4_ = fVar93 * fVar74 * fVar104;
      auVar148._8_4_ = fVar94 * fVar10 * fVar6;
      auVar148._12_4_ = fVar95 * fVar14 * fVar8;
      local_1d0._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
      local_1d0._8_4_ = -fVar11;
      local_1d0._12_4_ = -fVar15;
      auVar42 = vblendvps_avx(auVar83,local_1d0,auVar43);
      auVar75 = vsubps_avx(auVar135,auVar148);
      local_310 = vblendvps_avx(auVar42,auVar61,auVar41);
      local_1f0._0_8_ = local_230._0_8_ ^ 0x8000000080000000;
      local_1f0._8_4_ = -fVar10;
      local_1f0._12_4_ = -fVar14;
      auVar42 = vblendvps_avx(local_230,local_1f0,auVar43);
      local_300 = vblendvps_avx(auVar42,auVar75,auVar41);
      auVar42 = vrcpps_avx(auVar26);
      local_2b0 = auVar42._0_4_;
      auVar86._0_4_ = local_2b0 * fVar38;
      fStack_2ac = auVar42._4_4_;
      auVar86._4_4_ = fStack_2ac * fVar56;
      fStack_2a8 = auVar42._8_4_;
      auVar86._8_4_ = fStack_2a8 * fVar58;
      fStack_2a4 = auVar42._12_4_;
      auVar86._12_4_ = fStack_2a4 * fVar59;
      auVar151._8_4_ = 0x3f800000;
      auVar151._0_8_ = &DAT_3f8000003f800000;
      auVar151._12_4_ = 0x3f800000;
      auVar42 = vsubps_avx(auVar151,auVar86);
      local_2b0 = local_2b0 + local_2b0 * auVar42._0_4_;
      fStack_2ac = fStack_2ac + fStack_2ac * auVar42._4_4_;
      fStack_2a8 = fStack_2a8 + fStack_2a8 * auVar42._8_4_;
      fStack_2a4 = fStack_2a4 + fStack_2a4 * auVar42._12_4_;
      auVar173 = ZEXT1664(local_290);
      auVar136 = ZEXT1664(CONCAT412(local_240,CONCAT48(local_240,CONCAT44(local_240,local_240))));
      auVar168 = ZEXT1664(local_2a0);
      local_1c0 = fVar102 * (float)local_480._0_4_;
      fStack_1bc = fVar73 * (float)local_480._4_4_;
      fStack_1b8 = fVar9 * fStack_478;
      fStack_1b4 = fVar13 * fStack_474;
      auVar87._0_4_ =
           fVar102 * (float)local_480._0_4_ +
           (float)local_220._0_4_ * (fVar165 + local_240 * fVar39);
      auVar87._4_4_ =
           fVar73 * (float)local_480._4_4_ + (float)local_220._4_4_ * (fVar169 + local_240 * fVar57)
      ;
      auVar87._8_4_ = fVar9 * fStack_478 + fStack_218 * (fVar170 + local_240 * fVar105);
      auVar87._12_4_ = fVar13 * fStack_474 + fStack_214 * (fVar171 + local_240 * fVar114);
      local_250 = fVar102 * fVar88;
      fStack_24c = fVar73 * fVar93;
      fStack_248 = fVar9 * fVar94;
      fStack_244 = fVar13 * fVar95;
      auVar97._0_4_ = fVar102 * fVar88 * fVar72;
      auVar97._4_4_ = fVar73 * fVar93 * fVar104;
      auVar97._8_4_ = fVar9 * fVar94 * fVar6;
      auVar97._12_4_ = fVar13 * fVar95 * fVar8;
      auVar61 = vsubps_avx(auVar87,auVar97);
      local_200._0_8_ = local_290._0_8_ ^ 0x8000000080000000;
      local_200._8_4_ = -fVar9;
      local_200._12_4_ = -fVar13;
      auVar42 = vblendvps_avx(local_290,local_200,auVar43);
      local_2f0 = vblendvps_avx(auVar42,auVar61,auVar41);
      local_1e0 = vandnps_avx(auVar43,auVar151);
      auVar66._0_4_ = fVar72 * local_2b0;
      auVar66._4_4_ = fVar104 * fStack_2ac;
      auVar66._8_4_ = fVar6 * fStack_2a8;
      auVar66._12_4_ = fVar8 * fStack_2a4;
      local_340 = vblendvps_avx(local_1e0,auVar66,auVar41);
      local_320._0_4_ = fVar39 + (float)local_3e0._0_4_;
      local_320._4_4_ = fVar57 + (float)local_3e0._4_4_;
      local_320._8_4_ = fVar105 + fStack_3d8;
      local_320._12_4_ = fVar114 + fStack_3d4;
      auVar152 = ZEXT1664(local_320);
      local_330 = ZEXT816(0);
      auVar48._8_4_ = 0x7f800000;
      auVar48._0_8_ = 0x7f8000007f800000;
      auVar48._12_4_ = 0x7f800000;
      auVar41 = vblendvps_avx(auVar48,local_320,local_470);
      auVar43 = vshufps_avx(auVar41,auVar41,0xb1);
      auVar43 = vminps_avx(auVar43,auVar41);
      auVar42 = vshufpd_avx(auVar43,auVar43,1);
      auVar43 = vminps_avx(auVar42,auVar43);
      auVar41 = vcmpps_avx(auVar41,auVar43,0);
      auVar42 = local_470 & auVar41;
      auVar43 = vpcmpeqd_avx(auVar43,auVar43);
      auVar127 = ZEXT1664(_local_3a0);
      auVar149 = ZEXT1664(local_230);
      auVar155 = ZEXT1664(_local_440);
      if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar42[0xf] < '\0'
         ) {
        auVar43 = auVar41;
      }
      auVar41 = vandps_avx(local_470,auVar43);
      uVar27 = vmovmskps_avx(auVar41);
      uVar31 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar27);
      lVar36 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
        }
      }
      uVar28 = 1 << ((byte)k & 0x1f);
      uVar31 = (ulong)((uVar28 & 0xf) << 4);
      lVar32 = (long)((int)uVar28 >> 4) * 0x10;
      auVar52 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar161 = ZEXT3264(auVar52);
      local_458 = context;
      local_430 = pSVar35;
      local_428 = ray;
      do {
        auVar41 = auVar127._0_16_;
        local_3b0 = &local_180;
        auVar43 = auVar136._0_16_;
        auVar75 = auVar168._0_16_;
        auVar61 = auVar155._0_16_;
        auVar40 = auVar173._0_16_;
        auVar42 = auVar149._0_16_;
        uVar28 = *(uint *)(local_210 + lVar36 * 4);
        pRVar33 = (RayHitK<8> *)(ulong)uVar28;
        pGVar5 = (pSVar35->geometries).items[(long)pRVar33].ptr;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_470 + lVar36 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar27 = *(undefined4 *)(local_340 + lVar36 * 4);
            uVar29 = *(undefined4 *)(local_330 + lVar36 * 4);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + lVar36 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_310 + lVar36 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_300 + lVar36 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2f0 + lVar36 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar27;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar29;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[lVar36];
            *(uint *)(ray + k * 4 + 0x240) = uVar28;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            uVar27 = 0;
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_00fc40ec:
            uVar29 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar50._4_4_ = uVar29;
            auVar50._0_4_ = uVar29;
            auVar50._8_4_ = uVar29;
            auVar50._12_4_ = uVar29;
            auVar62 = vcmpps_avx(local_450,auVar50,2);
            auVar62 = vandps_avx(auVar62,local_360);
            auVar76 = local_370 & auVar62;
            if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar76 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar76 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar76[0xf]) {
              return;
            }
            auVar76 = vcmpps_avx(_local_280,local_380,0);
            auVar83 = vblendvps_avx(auVar83,local_1d0,auVar76);
            auVar42 = vblendvps_avx(auVar42,local_1f0,auVar76);
            auVar40 = vblendvps_avx(auVar40,local_200,auVar76);
            auVar76 = vcmpps_avx(_local_280,local_2c0,0);
            auVar77 = vcmpps_avx(_local_280,local_3f0,0);
            auVar76 = vorps_avx(auVar76,auVar77);
            fVar102 = local_280._0_4_;
            fVar103 = local_280._4_4_;
            fVar104 = local_280._8_4_;
            fVar60 = local_280._12_4_;
            auVar98._0_4_ =
                 (float)local_220._0_4_ * (fVar102 * auVar41._0_4_ + (float)local_350._0_4_) +
                 local_190;
            auVar98._4_4_ =
                 (float)local_220._4_4_ * (fVar103 * auVar41._4_4_ + (float)local_350._4_4_) +
                 fStack_18c;
            auVar98._8_4_ = fStack_218 * (fVar104 * auVar41._8_4_ + fStack_348) + fStack_188;
            auVar98._12_4_ = fStack_214 * (fVar60 * auVar41._12_4_ + fStack_344) + fStack_184;
            auVar113._0_4_ = (float)local_220._0_4_ * (auVar61._0_4_ + fVar96 * fVar102) + local_1a0
            ;
            auVar113._4_4_ =
                 (float)local_220._4_4_ * (auVar61._4_4_ + fVar96 * fVar103) + fStack_19c;
            auVar113._8_4_ = fStack_218 * (auVar61._8_4_ + fVar96 * fVar104) + fStack_198;
            auVar113._12_4_ = fStack_214 * (auVar61._12_4_ + fVar96 * fVar60) + fStack_194;
            auVar126._0_4_ =
                 (float)local_220._0_4_ * (auVar75._0_4_ + auVar43._0_4_ * fVar102) + local_1c0;
            auVar126._4_4_ =
                 (float)local_220._4_4_ * (auVar75._4_4_ + auVar43._4_4_ * fVar103) + fStack_1bc;
            auVar126._8_4_ = fStack_218 * (auVar75._8_4_ + auVar43._8_4_ * fVar104) + fStack_1b8;
            auVar126._12_4_ = fStack_214 * (auVar75._12_4_ + auVar43._12_4_ * fVar60) + fStack_1b4;
            auVar132._0_4_ = (float)local_270._0_4_ * local_1b0;
            auVar132._4_4_ = (float)local_270._4_4_ * fStack_1ac;
            auVar132._8_4_ = fStack_268 * fStack_1a8;
            auVar132._12_4_ = fStack_264 * fStack_1a4;
            auVar41 = vsubps_avx(auVar98,auVar132);
            local_310 = vblendvps_avx(auVar83,auVar41,auVar76);
            auVar99._0_4_ = (float)local_270._0_4_ * local_260;
            auVar99._4_4_ = (float)local_270._4_4_ * fStack_25c;
            auVar99._8_4_ = fStack_268 * fStack_258;
            auVar99._12_4_ = fStack_264 * fStack_254;
            auVar41 = vsubps_avx(auVar113,auVar99);
            local_300 = vblendvps_avx(auVar42,auVar41,auVar76);
            auVar100._0_4_ = (float)local_270._0_4_ * local_250;
            auVar100._4_4_ = (float)local_270._4_4_ * fStack_24c;
            auVar100._8_4_ = fStack_268 * fStack_248;
            auVar100._12_4_ = fStack_264 * fStack_244;
            auVar41 = vsubps_avx(auVar126,auVar100);
            local_2f0 = vblendvps_avx(auVar40,auVar41,auVar76);
            auVar101._0_4_ = (float)local_270._0_4_ * local_2b0;
            auVar101._4_4_ = (float)local_270._4_4_ * fStack_2ac;
            auVar101._8_4_ = fStack_268 * fStack_2a8;
            auVar101._12_4_ = fStack_264 * fStack_2a4;
            local_340 = vblendvps_avx(local_1e0,auVar101,auVar76);
            local_470 = vandps_avx(local_370,auVar62);
            auVar127 = ZEXT464(0) << 0x20;
            local_330 = ZEXT416(0) << 0x20;
            local_320 = local_450;
            auVar68._8_4_ = 0x7f800000;
            auVar68._0_8_ = 0x7f8000007f800000;
            auVar68._12_4_ = 0x7f800000;
            auVar41 = vblendvps_avx(auVar68,local_450,local_470);
            auVar43 = vshufps_avx(auVar41,auVar41,0xb1);
            auVar43 = vminps_avx(auVar43,auVar41);
            auVar83 = vshufpd_avx(auVar43,auVar43,1);
            auVar43 = vminps_avx(auVar83,auVar43);
            auVar43 = vcmpps_avx(auVar41,auVar43,0);
            pSVar35 = context->scene;
            auVar83 = local_470 & auVar43;
            auVar41 = local_470;
            if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar83[0xf] < '\0') {
              auVar41 = vandps_avx(auVar43,local_470);
            }
            uVar29 = vmovmskps_avx(auVar41);
            uVar28 = 1 << ((byte)k & 0x1f);
            lVar36 = 0;
            if (CONCAT44(uVar27,uVar29) != 0) {
              for (; (CONCAT44(uVar27,uVar29) >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
              }
            }
            uVar31 = (ulong)((uVar28 & 0xf) << 4);
            lVar32 = (long)((int)uVar28 >> 4) * 0x10;
            auVar52 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar136 = ZEXT3264(auVar52);
            do {
              local_3b0 = &local_180;
              uVar28 = *(uint *)(local_210 + lVar36 * 4);
              pRVar33 = (RayHitK<8> *)(ulong)uVar28;
              pGVar5 = (pSVar35->geometries).items[(long)pRVar33].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_470 + lVar36 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar27 = *(undefined4 *)(local_340 + lVar36 * 4);
                  uVar29 = *(undefined4 *)(local_330 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_310 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_300 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2f0 + lVar36 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar27;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar29;
                  *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[lVar36];
                  *(uint *)(ray + k * 4 + 0x240) = uVar28;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                local_120 = *(undefined4 *)(local_340 + lVar36 * 4);
                local_100 = *(undefined4 *)(local_330 + lVar36 * 4);
                local_e0 = (line->primIDs).field_0.i[lVar36];
                uVar27 = *(undefined4 *)(local_310 + lVar36 * 4);
                local_180._4_4_ = uVar27;
                local_180._0_4_ = uVar27;
                local_180._8_4_ = uVar27;
                local_180._12_4_ = uVar27;
                local_180._16_4_ = uVar27;
                local_180._20_4_ = uVar27;
                local_180._24_4_ = uVar27;
                local_180._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(local_300 + lVar36 * 4);
                local_160._4_4_ = uVar27;
                local_160._0_4_ = uVar27;
                local_160._8_4_ = uVar27;
                local_160._12_4_ = uVar27;
                local_160._16_4_ = uVar27;
                local_160._20_4_ = uVar27;
                local_160._24_4_ = uVar27;
                local_160._28_4_ = uVar27;
                auStack_b0 = vpshufd_avx(ZEXT416(uVar28),0);
                uVar27 = *(undefined4 *)(local_2f0 + lVar36 * 4);
                local_140._4_4_ = uVar27;
                local_140._0_4_ = uVar27;
                local_140._8_4_ = uVar27;
                local_140._12_4_ = uVar27;
                local_140._16_4_ = uVar27;
                local_140._20_4_ = uVar27;
                local_140._24_4_ = uVar27;
                local_140._28_4_ = uVar27;
                uStack_11c = local_120;
                uStack_118 = local_120;
                uStack_114 = local_120;
                uStack_110 = local_120;
                uStack_10c = local_120;
                uStack_108 = local_120;
                uStack_104 = local_120;
                uStack_fc = local_100;
                uStack_f8 = local_100;
                uStack_f4 = local_100;
                uStack_f0 = local_100;
                uStack_ec = local_100;
                uStack_e8 = local_100;
                uStack_e4 = local_100;
                uStack_dc = local_e0;
                uStack_d8 = local_e0;
                uStack_d4 = local_e0;
                uStack_d0 = local_e0;
                uStack_cc = local_e0;
                uStack_c8 = local_e0;
                uStack_c4 = local_e0;
                local_c0 = auStack_b0;
                _local_3a0 = auVar136._0_32_;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                uVar27 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + lVar36 * 4);
                local_420 = *(undefined8 *)(mm_lookupmask_ps + uVar31);
                uStack_418 = *(undefined8 *)(mm_lookupmask_ps + uVar31 + 8);
                local_410 = *(undefined8 *)(mm_lookupmask_ps + lVar32);
                uStack_408 = *(undefined8 *)(mm_lookupmask_ps + lVar32 + 8);
                local_3d0 = &local_420;
                local_3c8 = pGVar5->userPtr;
                local_3c0 = context->user;
                local_3a8 = 8;
                pRVar33 = (RayHitK<8> *)pGVar5->intersectionFilterN;
                local_3b8 = ray;
                if (pRVar33 != (RayHitK<8> *)0x0) {
                  pRVar33 = (RayHitK<8> *)(*(code *)pRVar33)(&local_3d0);
                  auVar136 = ZEXT3264(_local_3a0);
                  auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                  context = local_458;
                  ray = local_428;
                }
                auVar19._8_8_ = uStack_418;
                auVar19._0_8_ = local_420;
                auVar41 = vpcmpeqd_avx(auVar127._0_16_,auVar19);
                auVar23._8_8_ = uStack_408;
                auVar23._0_8_ = local_410;
                auVar43 = vpcmpeqd_avx(auVar127._0_16_,auVar23);
                auVar54._16_16_ = auVar43;
                auVar54._0_16_ = auVar41;
                _local_3a0 = auVar136._0_32_;
                auVar52 = _local_3a0 & ~auVar54;
                if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar52 >> 0x7f,0) == '\0') &&
                      (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar52 >> 0xbf,0) == '\0') &&
                    (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar52[0x1f]) {
                  auVar55._0_4_ = auVar136._0_4_ ^ auVar41._0_4_;
                  auVar55._4_4_ = auVar136._4_4_ ^ auVar41._4_4_;
                  auVar55._8_4_ = auVar136._8_4_ ^ auVar41._8_4_;
                  auVar55._12_4_ = auVar136._12_4_ ^ auVar41._12_4_;
                  auVar55._16_4_ = auVar136._16_4_ ^ auVar43._0_4_;
                  auVar55._20_4_ = auVar136._20_4_ ^ auVar43._4_4_;
                  auVar55._24_4_ = auVar136._24_4_ ^ auVar43._8_4_;
                  auVar55._28_4_ = auVar136._28_4_ ^ auVar43._12_4_;
                }
                else {
                  pRVar33 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar33 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    pRVar33 = (RayHitK<8> *)(*(code *)pRVar33)();
                    auVar136 = ZEXT3264(_local_3a0);
                    auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                    context = local_458;
                  }
                  auVar20._8_8_ = uStack_418;
                  auVar20._0_8_ = local_420;
                  auVar41 = vpcmpeqd_avx(auVar127._0_16_,auVar20);
                  auVar24._8_8_ = uStack_408;
                  auVar24._0_8_ = local_410;
                  auVar43 = vpcmpeqd_avx(auVar127._0_16_,auVar24);
                  auVar71._16_16_ = auVar43;
                  auVar71._0_16_ = auVar41;
                  auVar55._0_4_ = auVar136._0_4_ ^ auVar41._0_4_;
                  auVar55._4_4_ = auVar136._4_4_ ^ auVar41._4_4_;
                  auVar55._8_4_ = auVar136._8_4_ ^ auVar41._8_4_;
                  auVar55._12_4_ = auVar136._12_4_ ^ auVar41._12_4_;
                  auVar55._16_4_ = auVar136._16_4_ ^ auVar43._0_4_;
                  auVar55._20_4_ = auVar136._20_4_ ^ auVar43._4_4_;
                  auVar55._24_4_ = auVar136._24_4_ ^ auVar43._8_4_;
                  auVar55._28_4_ = auVar136._28_4_ ^ auVar43._12_4_;
                  auVar52 = auVar136._0_32_ & ~auVar71;
                  if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar52 >> 0x7f,0) != '\0') ||
                        (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar52 >> 0xbf,0) != '\0') ||
                      (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar52[0x1f] < '\0') {
                    auVar52 = vmaskmovps_avx(auVar55,*local_3b0);
                    *(undefined1 (*) [32])(local_3b8 + 0x180) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar55,local_3b0[1]);
                    *(undefined1 (*) [32])(local_3b8 + 0x1a0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar55,local_3b0[2]);
                    *(undefined1 (*) [32])(local_3b8 + 0x1c0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar55,local_3b0[3]);
                    *(undefined1 (*) [32])(local_3b8 + 0x1e0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar55,local_3b0[4]);
                    *(undefined1 (*) [32])(local_3b8 + 0x200) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar55,local_3b0[5]);
                    *(undefined1 (*) [32])(local_3b8 + 0x220) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar55,local_3b0[6]);
                    *(undefined1 (*) [32])(local_3b8 + 0x240) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar55,local_3b0[7]);
                    *(undefined1 (*) [32])(local_3b8 + 0x260) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar55,local_3b0[8]);
                    *(undefined1 (*) [32])(local_3b8 + 0x280) = auVar52;
                    pRVar33 = local_3b8;
                  }
                }
                if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar55 >> 0x7f,0) == '\0') &&
                      (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar55 >> 0xbf,0) == '\0') &&
                    (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar55[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar27;
                }
                *(undefined4 *)(local_470 + lVar36 * 4) = 0;
                uVar27 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar51._4_4_ = uVar27;
                auVar51._0_4_ = uVar27;
                auVar51._8_4_ = uVar27;
                auVar51._12_4_ = uVar27;
                auVar41 = vcmpps_avx(local_450,auVar51,2);
                local_470 = vandps_avx(auVar41,local_470);
              }
              if ((((local_470 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_470 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_470 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_470[0xf]) {
                return;
              }
              auVar69._8_4_ = 0x7f800000;
              auVar69._0_8_ = 0x7f8000007f800000;
              auVar69._12_4_ = 0x7f800000;
              auVar41 = vblendvps_avx(auVar69,local_450,local_470);
              auVar43 = vshufps_avx(auVar41,auVar41,0xb1);
              auVar43 = vminps_avx(auVar43,auVar41);
              auVar83 = vshufpd_avx(auVar43,auVar43,1);
              auVar43 = vminps_avx(auVar83,auVar43);
              auVar43 = vcmpps_avx(auVar41,auVar43,0);
              auVar83 = local_470 & auVar43;
              auVar41 = local_470;
              if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar83[0xf] < '\0') {
                auVar41 = vandps_avx(auVar43,local_470);
              }
              uVar27 = vmovmskps_avx(auVar41);
              uVar34 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar27);
              lVar36 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
            } while( true );
          }
          local_120 = *(undefined4 *)(local_340 + lVar36 * 4);
          local_100 = *(undefined4 *)(local_330 + lVar36 * 4);
          local_e0 = (line->primIDs).field_0.i[lVar36];
          local_180._4_4_ = *(undefined4 *)(local_310 + lVar36 * 4);
          uVar27 = *(undefined4 *)(local_300 + lVar36 * 4);
          local_160._4_4_ = uVar27;
          local_160._0_4_ = uVar27;
          local_160._8_4_ = uVar27;
          local_160._12_4_ = uVar27;
          local_160._16_4_ = uVar27;
          local_160._20_4_ = uVar27;
          local_160._24_4_ = uVar27;
          local_160._28_4_ = uVar27;
          auStack_b0 = vpshufd_avx(ZEXT416(uVar28),0);
          uVar27 = *(undefined4 *)(local_2f0 + lVar36 * 4);
          local_140._4_4_ = uVar27;
          local_140._0_4_ = uVar27;
          local_140._8_4_ = uVar27;
          local_140._12_4_ = uVar27;
          local_140._16_4_ = uVar27;
          local_140._20_4_ = uVar27;
          local_140._24_4_ = uVar27;
          local_140._28_4_ = uVar27;
          local_180._0_4_ = local_180._4_4_;
          local_180._8_4_ = local_180._4_4_;
          local_180._12_4_ = local_180._4_4_;
          local_180._16_4_ = local_180._4_4_;
          local_180._20_4_ = local_180._4_4_;
          local_180._24_4_ = local_180._4_4_;
          local_180._28_4_ = local_180._4_4_;
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          uVar27 = *(undefined4 *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + lVar36 * 4);
          local_420 = *(undefined8 *)(mm_lookupmask_ps + uVar31);
          uStack_418 = *(undefined8 *)(mm_lookupmask_ps + uVar31 + 8);
          local_410 = *(undefined8 *)(mm_lookupmask_ps + lVar32);
          uStack_408 = *(undefined8 *)(mm_lookupmask_ps + lVar32 + 8);
          local_3d0 = &local_420;
          local_3c8 = pGVar5->userPtr;
          local_3c0 = context->user;
          local_3a8 = 8;
          pRVar33 = (RayHitK<8> *)pGVar5->intersectionFilterN;
          local_3b8 = ray;
          if (pRVar33 != (RayHitK<8> *)0x0) {
            _local_3e0 = auVar152._0_16_;
            local_2e0 = auVar161._0_32_;
            pRVar33 = (RayHitK<8> *)(*(code *)pRVar33)(&local_3d0);
            auVar161 = ZEXT3264(local_2e0);
            auVar152 = ZEXT1664(_local_3e0);
            auVar168 = ZEXT1664(local_2a0);
            auVar155 = ZEXT1664(_local_440);
            auVar173 = ZEXT1664(local_290);
            auVar149 = ZEXT1664(local_230);
            auVar136 = ZEXT1664(CONCAT412(fStack_234,
                                          CONCAT48(fStack_238,CONCAT44(fStack_23c,local_240))));
            auVar127 = ZEXT1664(_local_3a0);
            pSVar35 = local_430;
            context = local_458;
            ray = local_428;
          }
          auVar17._8_8_ = uStack_418;
          auVar17._0_8_ = local_420;
          auVar41 = vpcmpeqd_avx((undefined1  [16])0x0,auVar17);
          auVar21._8_8_ = uStack_408;
          auVar21._0_8_ = local_410;
          auVar43 = vpcmpeqd_avx((undefined1  [16])0x0,auVar21);
          auVar52._16_16_ = auVar43;
          auVar52._0_16_ = auVar41;
          auVar52 = auVar161._0_32_ & ~auVar52;
          if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar52 >> 0x7f,0) == '\0') &&
                (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar52 >> 0xbf,0) == '\0') &&
              (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar52[0x1f]) {
            auVar53._0_4_ = auVar161._0_4_ ^ auVar41._0_4_;
            auVar53._4_4_ = auVar161._4_4_ ^ auVar41._4_4_;
            auVar53._8_4_ = auVar161._8_4_ ^ auVar41._8_4_;
            auVar53._12_4_ = auVar161._12_4_ ^ auVar41._12_4_;
            auVar53._16_4_ = auVar161._16_4_ ^ auVar43._0_4_;
            auVar53._20_4_ = auVar161._20_4_ ^ auVar43._4_4_;
            auVar53._24_4_ = auVar161._24_4_ ^ auVar43._8_4_;
            auVar53._28_4_ = auVar161._28_4_ ^ auVar43._12_4_;
          }
          else {
            pRVar33 = (RayHitK<8> *)context->args->filter;
            if ((pRVar33 != (RayHitK<8> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              _local_3e0 = auVar152._0_16_;
              local_2e0 = auVar161._0_32_;
              pRVar33 = (RayHitK<8> *)(*(code *)pRVar33)(&local_3d0);
              auVar161 = ZEXT3264(local_2e0);
              auVar152 = ZEXT1664(_local_3e0);
              auVar168 = ZEXT1664(local_2a0);
              auVar155 = ZEXT1664(_local_440);
              auVar173 = ZEXT1664(local_290);
              auVar149 = ZEXT1664(local_230);
              auVar136 = ZEXT1664(CONCAT412(fStack_234,
                                            CONCAT48(fStack_238,CONCAT44(fStack_23c,local_240))));
              auVar127 = ZEXT1664(_local_3a0);
              pSVar35 = local_430;
              context = local_458;
            }
            auVar18._8_8_ = uStack_418;
            auVar18._0_8_ = local_420;
            auVar41 = vpcmpeqd_avx((undefined1  [16])0x0,auVar18);
            auVar22._8_8_ = uStack_408;
            auVar22._0_8_ = local_410;
            auVar43 = vpcmpeqd_avx((undefined1  [16])0x0,auVar22);
            auVar70._16_16_ = auVar43;
            auVar70._0_16_ = auVar41;
            auVar53._0_4_ = auVar161._0_4_ ^ auVar41._0_4_;
            auVar53._4_4_ = auVar161._4_4_ ^ auVar41._4_4_;
            auVar53._8_4_ = auVar161._8_4_ ^ auVar41._8_4_;
            auVar53._12_4_ = auVar161._12_4_ ^ auVar41._12_4_;
            auVar53._16_4_ = auVar161._16_4_ ^ auVar43._0_4_;
            auVar53._20_4_ = auVar161._20_4_ ^ auVar43._4_4_;
            auVar53._24_4_ = auVar161._24_4_ ^ auVar43._8_4_;
            auVar53._28_4_ = auVar161._28_4_ ^ auVar43._12_4_;
            auVar52 = auVar161._0_32_ & ~auVar70;
            if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar52 >> 0x7f,0) != '\0') ||
                  (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar52 >> 0xbf,0) != '\0') ||
                (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar52[0x1f] < '\0') {
              auVar52 = vmaskmovps_avx(auVar53,*local_3b0);
              *(undefined1 (*) [32])(local_3b8 + 0x180) = auVar52;
              auVar52 = vmaskmovps_avx(auVar53,local_3b0[1]);
              *(undefined1 (*) [32])(local_3b8 + 0x1a0) = auVar52;
              auVar52 = vmaskmovps_avx(auVar53,local_3b0[2]);
              *(undefined1 (*) [32])(local_3b8 + 0x1c0) = auVar52;
              auVar52 = vmaskmovps_avx(auVar53,local_3b0[3]);
              *(undefined1 (*) [32])(local_3b8 + 0x1e0) = auVar52;
              auVar52 = vmaskmovps_avx(auVar53,local_3b0[4]);
              *(undefined1 (*) [32])(local_3b8 + 0x200) = auVar52;
              auVar52 = vmaskmovps_avx(auVar53,local_3b0[5]);
              *(undefined1 (*) [32])(local_3b8 + 0x220) = auVar52;
              auVar52 = vmaskmovps_avx(auVar53,local_3b0[6]);
              *(undefined1 (*) [32])(local_3b8 + 0x240) = auVar52;
              auVar52 = vmaskmovps_avx(auVar53,local_3b0[7]);
              *(undefined1 (*) [32])(local_3b8 + 0x260) = auVar52;
              auVar52 = vmaskmovps_avx(auVar53,local_3b0[8]);
              *(undefined1 (*) [32])(local_3b8 + 0x280) = auVar52;
              pRVar33 = local_3b8;
            }
          }
          if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar53 >> 0x7f,0) == '\0') &&
                (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar53 >> 0xbf,0) == '\0') &&
              (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar53[0x1f]) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar27;
          }
          *(undefined4 *)(local_470 + lVar36 * 4) = 0;
          uVar27 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar49._4_4_ = uVar27;
          auVar49._0_4_ = uVar27;
          auVar49._8_4_ = uVar27;
          auVar49._12_4_ = uVar27;
          auVar41 = vcmpps_avx(auVar152._0_16_,auVar49,2);
          local_470 = vandps_avx(auVar41,local_470);
        }
        uVar27 = (undefined4)((ulong)pRVar33 >> 0x20);
        auVar41 = auVar127._0_16_;
        auVar43 = auVar136._0_16_;
        auVar75 = auVar168._0_16_;
        auVar61 = auVar155._0_16_;
        auVar40 = auVar173._0_16_;
        auVar42 = auVar149._0_16_;
        if ((((local_470 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_470 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_470 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_470[0xf]) goto LAB_00fc40ec;
        auVar67._8_4_ = 0x7f800000;
        auVar67._0_8_ = 0x7f8000007f800000;
        auVar67._12_4_ = 0x7f800000;
        auVar41 = vblendvps_avx(auVar67,auVar152._0_16_,local_470);
        auVar43 = vshufps_avx(auVar41,auVar41,0xb1);
        auVar43 = vminps_avx(auVar43,auVar41);
        auVar42 = vshufpd_avx(auVar43,auVar43,1);
        auVar43 = vminps_avx(auVar42,auVar43);
        auVar43 = vcmpps_avx(auVar41,auVar43,0);
        auVar42 = local_470 & auVar43;
        auVar41 = local_470;
        if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar42[0xf] < '\0') {
          auVar41 = vandps_avx(auVar43,local_470);
        }
        uVar29 = vmovmskps_avx(auVar41);
        lVar36 = 0;
        if (CONCAT44(uVar27,uVar29) != 0) {
          for (; (CONCAT44(uVar27,uVar29) >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context,  const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }